

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O0

bool __thiscall SCCLiveness::FoldIndir(SCCLiveness *this,Instr *instr,Opnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  IRType type;
  int32 iVar5;
  RegOpnd *pRVar6;
  void *pMemLoc;
  undefined4 *puVar7;
  MemRefOpnd *newSrc;
  RegOpnd *pRVar8;
  MemRefOpnd *memref;
  uint8 *constValue;
  RegOpnd *base;
  RegOpnd *pRStack_38;
  int32 offset;
  RegOpnd *index;
  IndirOpnd *indir;
  Opnd *opnd_local;
  Instr *instr_local;
  SCCLiveness *this_local;
  
  indir = (IndirOpnd *)opnd;
  opnd_local = (Opnd *)instr;
  instr_local = (Instr *)this;
  index = (RegOpnd *)IR::Opnd::AsIndirOpnd(opnd);
  pRVar6 = IR::IndirOpnd::GetIndexOpnd((IndirOpnd *)index);
  if (pRVar6 != (RegOpnd *)0x0) {
    pRStack_38 = IR::IndirOpnd::GetIndexOpnd((IndirOpnd *)index);
    if ((pRStack_38->m_sym == (StackSym *)0x0) ||
       (bVar2 = StackSym::IsIntConst(pRStack_38->m_sym), !bVar2)) {
      return false;
    }
    base._4_4_ = StackSym::GetIntConstValue(pRStack_38->m_sym);
    bVar3 = IR::IndirOpnd::GetScale((IndirOpnd *)index);
    iVar5 = base._4_4_;
    if (bVar3 != '\0') {
      bVar4 = IR::IndirOpnd::GetScale((IndirOpnd *)index);
      bVar2 = Int32Math::Shl(iVar5,(uint)bVar4,(int32 *)((long)&base + 4));
      if (bVar2) {
        return false;
      }
    }
    iVar5 = IR::IndirOpnd::GetOffset((IndirOpnd *)index);
    if (iVar5 != 0) {
      iVar5 = IR::IndirOpnd::GetOffset((IndirOpnd *)index);
      bVar2 = Int32Math::Add(iVar5,base._4_4_,(int32 *)((long)&base + 4));
      if (bVar2) {
        return false;
      }
    }
    IR::IndirOpnd::SetOffset((IndirOpnd *)index,base._4_4_,false);
    IR::IndirOpnd::SetIndexOpnd((IndirOpnd *)index,(RegOpnd *)0x0);
  }
  pRVar6 = IR::IndirOpnd::GetBaseOpnd((IndirOpnd *)index);
  memref = (MemRefOpnd *)0x0;
  if (pRVar6 != (RegOpnd *)0x0) {
    if ((((pRVar6->m_sym == (StackSym *)0x0) || (bVar2 = StackSym::IsConst(pRVar6->m_sym), !bVar2))
        || (bVar2 = StackSym::IsIntConst(pRVar6->m_sym), bVar2)) ||
       (bVar2 = StackSym::IsFloatConst(pRVar6->m_sym), bVar2)) {
      return false;
    }
    memref = (MemRefOpnd *)StackSym::GetConstAddress(pRVar6->m_sym,false);
    iVar5 = IR::IndirOpnd::GetOffset((IndirOpnd *)index);
    if (iVar5 < 0) {
      iVar5 = IR::IndirOpnd::GetOffset((IndirOpnd *)index);
      if (memref < (MemRefOpnd *)((long)&(memref->super_Opnd)._vptr_Opnd + (long)iVar5)) {
        return false;
      }
    }
    else {
      iVar5 = IR::IndirOpnd::GetOffset((IndirOpnd *)index);
      if ((MemRefOpnd *)((long)&(memref->super_Opnd)._vptr_Opnd + (long)iVar5) < memref) {
        return false;
      }
    }
  }
  iVar5 = IR::IndirOpnd::GetOffset((IndirOpnd *)index);
  pMemLoc = (void *)((long)&(memref->super_Opnd)._vptr_Opnd + (long)iVar5);
  bVar2 = Math::FitsInDWord((size_t)pMemLoc);
  if (bVar2) {
    type = IR::Opnd::GetType(&index->super_Opnd);
    newSrc = IR::MemRefOpnd::New(pMemLoc,type,(Func *)opnd_local[2]._vptr_Opnd,
                                 AddrOpndKindDynamicMisc);
    pRVar6 = index;
    pRVar8 = (RegOpnd *)IR::Instr::GetDst((Instr *)opnd_local);
    if (pRVar6 == pRVar8) {
      IR::Instr::ReplaceDst((Instr *)opnd_local,&newSrc->super_Opnd);
    }
    else {
      IR::Instr::ReplaceSrc((Instr *)opnd_local,&index->super_Opnd,&newSrc->super_Opnd);
    }
    this_local._7_1_ = true;
  }
  else {
    if (pRVar6 == (RegOpnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                         ,0x352,"(base != nullptr)","base != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
SCCLiveness::FoldIndir(IR::Instr *instr, IR::Opnd *opnd)
{
#ifdef _M_ARM32_OR_ARM64
    // Can't be folded on ARM or ARM64
    return false;
#else
    IR::IndirOpnd *indir = opnd->AsIndirOpnd();

    if(indir->GetIndexOpnd())
    {
        IR::RegOpnd *index = indir->GetIndexOpnd();
        if (!index->m_sym || !index->m_sym->IsIntConst())
        {
            return false;
        }

        // offset = indir.offset + (index << scale)
        int32 offset = index->m_sym->GetIntConstValue();
        if((indir->GetScale() != 0 && Int32Math::Shl(offset, indir->GetScale(), &offset)) ||
           (indir->GetOffset() != 0 && Int32Math::Add(indir->GetOffset(), offset, &offset)))
        {
            return false;
        }
        indir->SetOffset(offset);
        indir->SetIndexOpnd(nullptr);
    }

    IR::RegOpnd *base = indir->GetBaseOpnd();
    uint8 *constValue = nullptr;
    if (base)
    {
        if (!base->m_sym || !base->m_sym->IsConst() || base->m_sym->IsIntConst() || base->m_sym->IsFloatConst())
        {
            return false;
        }
        constValue = static_cast<uint8 *>(base->m_sym->GetConstAddress());
        if (indir->GetOffset() < 0 ? constValue + indir->GetOffset() > constValue : constValue + indir->GetOffset() < constValue)
        {
            return false;
        }
    }
    constValue += indir->GetOffset();

#ifdef _M_X64
    // Encoding only allows 32bits worth
    if(!Math::FitsInDWord((size_t)constValue))
    {
        Assert(base != nullptr);
        return false;
    }
#endif

    IR::MemRefOpnd *memref = IR::MemRefOpnd::New(constValue, indir->GetType(), instr->m_func);

    if (indir == instr->GetDst())
    {
        instr->ReplaceDst(memref);
    }
    else
    {
        instr->ReplaceSrc(indir, memref);
    }
    return true;
#endif
}